

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_update_noise_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  INT8 IVar1;
  ushort uVar2;
  UINT32 UVar3;
  UINT16 feedback;
  UINT32 period;
  UINT32 cycles_local;
  SOUND *snd_local;
  gb_sound_t *gb_local;
  
  UVar3 = gb_noise_period_cycles(gb);
  snd->cycles_left = cycles + snd->cycles_left;
  while (UVar3 <= (uint)snd->cycles_left) {
    snd->cycles_left = snd->cycles_left - UVar3;
    uVar2 = ((ushort)((int)(uint)snd->noise_lfsr >> 1) ^ snd->noise_lfsr) & 1;
    snd->noise_lfsr = (ushort)((int)(uint)snd->noise_lfsr >> 1) | uVar2 << 0xe;
    if ((snd->noise_short & 1U) != 0) {
      snd->noise_lfsr = snd->noise_lfsr & 0xffbf | uVar2 << 6;
    }
    IVar1 = '\x01';
    if ((snd->noise_lfsr & 1) != 0) {
      IVar1 = -1;
    }
    snd->signal = IVar1;
  }
  return;
}

Assistant:

static void gb_update_noise_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	UINT32 period = gb_noise_period_cycles(gb);
	snd->cycles_left += cycles;
	while (snd->cycles_left >= period)
	{
		UINT16 feedback;
		snd->cycles_left -= period;

		// Using a Polynomial Counter (aka Linear Feedback Shift Register)
		// Mode 4 has a 15 bit counter so we need to shift the bits around accordingly.
		feedback = ((snd->noise_lfsr >> 1) ^ snd->noise_lfsr) & 1;
		snd->noise_lfsr = (snd->noise_lfsr >> 1) | (feedback << 14);
		if (snd->noise_short)
		{
			snd->noise_lfsr = (snd->noise_lfsr & ~(1 << 6)) | (feedback << 6);
		}
		snd->signal = (snd->noise_lfsr & 1) ? -1 : 1;
	}
}